

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMPIR.cpp
# Opt level: O2

OpenMPClause *
OpenMPLastprivateClause::addLastprivateClause
          (OpenMPDirective *directive,OpenMPLastprivateClauseModifier modifier)

{
  pointer ppOVar1;
  vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_> *pvVar2;
  mapped_type *ppvVar3;
  iterator it;
  pointer ppOVar4;
  OpenMPClause *local_28;
  key_type local_1c;
  
  pvVar2 = OpenMPDirective::getClauses(directive,OMPC_lastprivate);
  ppOVar4 = (pvVar2->super__Vector_base<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  ppOVar1 = (pvVar2->super__Vector_base<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppOVar1 == ppOVar4) {
    local_28 = (OpenMPClause *)operator_new(0x70);
    (local_28->super_SourceLocation).line = 0;
    (local_28->super_SourceLocation).column = 0;
    (local_28->super_SourceLocation).parent_construct = (SourceLocation *)0x0;
    local_28->kind = OMPC_lastprivate;
    local_28->clause_position = -1;
    (local_28->expressions).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (local_28->expressions).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (local_28->expressions).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (local_28->expressionNodes).super__Vector_base<const_void_*,_std::allocator<const_void_*>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (local_28->locations).super__Vector_base<SourceLocation,_std::allocator<SourceLocation>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (local_28->expressionNodes).super__Vector_base<const_void_*,_std::allocator<const_void_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (local_28->expressionNodes).super__Vector_base<const_void_*,_std::allocator<const_void_*>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (local_28->locations).super__Vector_base<SourceLocation,_std::allocator<SourceLocation>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (local_28->locations).super__Vector_base<SourceLocation,_std::allocator<SourceLocation>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_28->_vptr_OpenMPClause = (_func_int **)&PTR_toString_abi_cxx11__0019d400;
    *(OpenMPLastprivateClauseModifier *)&local_28[1]._vptr_OpenMPClause = modifier;
    pvVar2 = (vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_> *)operator_new(0x18);
    (pvVar2->super__Vector_base<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pvVar2->super__Vector_base<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (pvVar2->super__Vector_base<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>::push_back(pvVar2,&local_28);
    local_1c = OMPC_lastprivate;
    ppvVar3 = std::
              map<OpenMPClauseKind,_std::vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>_*,_std::less<OpenMPClauseKind>,_std::allocator<std::pair<const_OpenMPClauseKind,_std::vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>_*>_>_>
              ::operator[](&directive->clauses,&local_1c);
    *ppvVar3 = pvVar2;
  }
  else {
    do {
      if (ppOVar4 == ppOVar1) {
        local_28 = (OpenMPClause *)operator_new(0x70);
        (local_28->super_SourceLocation).line = 0;
        (local_28->super_SourceLocation).column = 0;
        (local_28->super_SourceLocation).parent_construct = (SourceLocation *)0x0;
        local_28->kind = OMPC_lastprivate;
        local_28->clause_position = -1;
        (local_28->expressions).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (local_28->expressions).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        (local_28->expressions).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        (local_28->expressionNodes).super__Vector_base<const_void_*,_std::allocator<const_void_*>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (local_28->locations).super__Vector_base<SourceLocation,_std::allocator<SourceLocation>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        (local_28->expressionNodes).super__Vector_base<const_void_*,_std::allocator<const_void_*>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        (local_28->expressionNodes).super__Vector_base<const_void_*,_std::allocator<const_void_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        (local_28->locations).super__Vector_base<SourceLocation,_std::allocator<SourceLocation>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (local_28->locations).super__Vector_base<SourceLocation,_std::allocator<SourceLocation>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_28->_vptr_OpenMPClause = (_func_int **)&PTR_toString_abi_cxx11__0019d400;
        *(OpenMPLastprivateClauseModifier *)&local_28[1]._vptr_OpenMPClause = modifier;
        std::vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>::push_back(pvVar2,&local_28);
        return local_28;
      }
      local_28 = *ppOVar4;
      ppOVar4 = ppOVar4 + 1;
    } while (*(OpenMPLastprivateClauseModifier *)&local_28[1]._vptr_OpenMPClause != modifier);
  }
  return local_28;
}

Assistant:

OpenMPClause* OpenMPLastprivateClause::addLastprivateClause(OpenMPDirective *directive, OpenMPLastprivateClauseModifier modifier) {

    std::map<OpenMPClauseKind, std::vector<OpenMPClause*>* >* all_clauses = directive->getAllClauses();
    std::vector<OpenMPClause*>* current_clauses = directive->getClauses(OMPC_lastprivate);
    OpenMPClause* new_clause = NULL;

    if (current_clauses->size() == 0) {
        new_clause = new OpenMPLastprivateClause(modifier);
        current_clauses = new std::vector<OpenMPClause*>();
        current_clauses->push_back(new_clause);
        (*all_clauses)[OMPC_lastprivate] = current_clauses;
        } else {
            for(std::vector<OpenMPClause*>::iterator it = current_clauses->begin(); it != current_clauses->end(); ++it) {

                if (((OpenMPLastprivateClause*)(*it))->getModifier() == modifier) {
                    new_clause = (*it);
                    return new_clause;
                };
            };
            new_clause = new OpenMPLastprivateClause(modifier);
            current_clauses->push_back(new_clause);
        }
    return new_clause;
}